

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
           *this,GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          VWReaderHandler<false> *handler)

{
  undefined1 uVar1;
  Ch CVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *in_RSI;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_RDI;
  ParseResult PVar6;
  ClearStackOnExit scope;
  undefined4 in_stack_ffffffffffffffa8;
  ParseErrorCode in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ClearStackOnExit local_30 [2];
  GenericInsituStringStream<rapidjson::UTF8<char>_> *local_20;
  ulong local_10;
  size_t local_8;
  
  local_20 = in_RSI;
  ParseResult::Clear((ParseResult *)0x26e706);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ClearStackOnExit::ClearStackOnExit(local_30,in_RDI);
  SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
            ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
             )CONCAT17(in_stack_ffffffffffffffb7,
                       CONCAT16(in_stack_ffffffffffffffb6,
                                CONCAT15(in_stack_ffffffffffffffb5,
                                         CONCAT14(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0)))),
             (GenericInsituStringStream<rapidjson::UTF8<char>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  uVar1 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)0x26e732);
  if ((bool)uVar1) {
    local_10 = *(ulong *)&in_RDI->parseResult_;
    local_8 = (in_RDI->parseResult_).offset_;
    goto LAB_0026e971;
  }
  CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(local_20);
  if (CVar2 == '\0') {
    GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(local_20);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                             CONCAT15(in_stack_ffffffffffffffb5,
                                                      CONCAT14(in_stack_ffffffffffffffb4,
                                                               in_stack_ffffffffffffffb0)))),
                  in_stack_ffffffffffffffac,0x26e7c6);
    bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x26e7d4);
    if (bVar5) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0026e971;
    }
  }
  else {
    ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
              ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (GenericInsituStringStream<rapidjson::UTF8<char>_> *)in_RDI,
               (VWReaderHandler<false> *)
               CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                       CONCAT15(in_stack_ffffffffffffffb5,
                                                CONCAT14(in_stack_ffffffffffffffb4,
                                                         in_stack_ffffffffffffffb0)))));
    uVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x26e837);
    if ((bool)uVar3) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0026e971;
    }
    SkipWhitespaceAndComments<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
              ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                          CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffffb4,
                                                                  in_stack_ffffffffffffffb0)))),
               (GenericInsituStringStream<rapidjson::UTF8<char>_> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    uVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)0x26e890);
    if ((bool)uVar4) {
      local_10 = *(ulong *)&in_RDI->parseResult_;
      local_8 = (in_RDI->parseResult_).offset_;
      goto LAB_0026e971;
    }
    CVar2 = GenericInsituStringStream<rapidjson::UTF8<char>_>::Peek(local_20);
    if (CVar2 != '\0') {
      GenericInsituStringStream<rapidjson::UTF8<char>_>::Tell(local_20);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                               CONCAT15(uVar3,CONCAT14(uVar4,
                                                  in_stack_ffffffffffffffb0)))),
                    in_stack_ffffffffffffffac,0x26e907);
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)0x26e915);
      if (bVar5) {
        local_10 = *(ulong *)&in_RDI->parseResult_;
        local_8 = (in_RDI->parseResult_).offset_;
        goto LAB_0026e971;
      }
    }
  }
  local_10 = *(ulong *)&in_RDI->parseResult_;
  local_8 = (in_RDI->parseResult_).offset_;
LAB_0026e971:
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  ClearStackOnExit::~ClearStackOnExit((ClearStackOnExit *)0x26e97b);
  PVar6._0_8_ = local_10 & 0xffffffff;
  PVar6.offset_ = local_8;
  return PVar6;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }